

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

size_t buffer_good_alloc_size(size_t requested_alloc)

{
  size_t good_alloc;
  size_t requested_alloc_local;
  
  if (requested_alloc < 0x101) {
    for (good_alloc = 0x10; good_alloc < requested_alloc; good_alloc = good_alloc << 1) {
    }
  }
  else {
    for (good_alloc = 0x200; good_alloc - 0x20 < requested_alloc; good_alloc = good_alloc << 1) {
    }
    good_alloc = good_alloc - 0x20;
  }
  return good_alloc;
}

Assistant:

static size_t
buffer_good_alloc_size(size_t requested_alloc)
{
    size_t good_alloc;

    if(requested_alloc <= 256) {
        good_alloc = 16;
        while(good_alloc < requested_alloc)
            good_alloc *= 2;
    } else {
        /* For larger buffers we subtract 32 bytes as the libc heap allocator
         * needs some space for internal bookkeeping, and these would cause
         * that two small blocks cannot fit into a window previously freed
         * from twice as malloc'ed block.
         *
         * (AFAIK, most allocators use 8 or 16 bytes for the purpose, but lets
         * be little bit more conservative.)
         */
        good_alloc = 512;
        while(good_alloc-32 < requested_alloc)
            good_alloc *= 2;
        good_alloc -= 32;
    }

    return good_alloc;
}